

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall twitter::zipkin::thrift::Response::read(Response *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  read((Response *)(&this->field_0x0 + *(long *)(*(long *)this + -0x20)),in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t Response::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_ok = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_BOOL) {
          xfer += iprot->readBool(this->ok);
          isset_ok = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_ok)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}